

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O3

void helicsFilterSet(HelicsFilter filt,char *prop,double val,HelicsError *err)

{
  Filter *pFVar1;
  FilterObject *pFVar2;
  size_t sVar3;
  
  pFVar2 = anon_unknown.dwarf_ba607::getFilterObj(filt,err);
  if ((pFVar2 != (FilterObject *)0x0) && (pFVar1 = pFVar2->filtPtr, pFVar1 != (Filter *)0x0)) {
    if (prop == (char *)0x0) {
      if (err != (HelicsError *)0x0) {
        err->error_code = -4;
        err->message = "The supplied string argument is null and therefore invalid";
      }
    }
    else {
      sVar3 = strlen(prop);
      (*(pFVar1->super_Interface)._vptr_Interface[5])(val,pFVar1,sVar3,prop);
    }
  }
  return;
}

Assistant:

void helicsFilterSet(HelicsFilter filt, const char* prop, double val, HelicsError* err)
{
    auto* filter = getFilter(filt, err);
    if (filter == nullptr) {
        return;
    }
    CHECK_NULL_STRING(prop, void());
    try {
        filter->set(prop, val);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}